

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KUtils.h
# Opt level: O1

KString * KDIS::UTILS::IndentString
                    (KString *__return_storage_ptr__,KString *S,KUINT16 Tabs,KCHAR8 Tab)

{
  ulong uVar1;
  ulong uVar2;
  ushort uVar3;
  KStringStream NewS;
  char local_1b1;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1b1 = '\t';
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_1b1,1);
  uVar1 = S->_M_string_length;
  if (uVar1 != 0) {
    uVar3 = 1;
    uVar2 = 0;
    do {
      local_1b1 = (S->_M_dataplus)._M_p[uVar2];
      if (uVar1 - 1 == uVar2 || local_1b1 != '\n') {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_1b1,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_1b1,1);
        local_1b1 = '\t';
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_1b1,1);
      }
      uVar2 = (ulong)uVar3;
      uVar1 = S->_M_string_length;
      uVar3 = uVar3 + 1;
    } while (uVar2 < uVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

static inline KString IndentString( const KString & S, KUINT16 Tabs = 1, KCHAR8 Tab = '\t' )
{
    KStringStream NewS;

    // Add tab to first item and then check all new lines
    AddTabsToStringStream( NewS, Tabs, Tab );

    for( KUINT16 i = 0; i < S.size(); ++i )
    {
        if( S.c_str()[i] == '\n' && i != ( S.size() - 1 ) )
        {
            NewS << S.c_str()[i];
            AddTabsToStringStream( NewS, Tabs, Tab );
        }
        else
        {
            NewS << S.c_str()[i];
        }
    }

    return NewS.str();
}